

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall spectest::JSONParser::ExpectKey(JSONParser *this,char *key)

{
  long lVar1;
  Result RVar2;
  Enum EVar3;
  size_t sVar4;
  undefined8 uStack_30;
  char acStack_28 [8];
  
  uStack_30 = 0x1254dc;
  sVar4 = strlen(key);
  lVar1 = -(sVar4 + 0x12 & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x125505;
  snprintf(acStack_28 + lVar1,sVar4 + 3,"\"%s\"",key);
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x125510;
  RVar2 = Expect(this,acStack_28 + lVar1);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x12552b;
    RVar2 = Expect(this,":");
    EVar3 = (Enum)(RVar2.enum_ == Error);
  }
  return (Result)EVar3;
}

Assistant:

wabt::Result JSONParser::ExpectKey(const char* key) {
  size_t keylen = strlen(key);
  size_t quoted_len = keylen + 2 + 1;
  char* quoted = static_cast<char*>(alloca(quoted_len));
  snprintf(quoted, quoted_len, "\"%s\"", key);
  EXPECT(quoted);
  EXPECT(":");
  return wabt::Result::Ok;
}